

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjust-times.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  timespec ts;
  timespec ts_00;
  timespec time_to_set_00;
  FILE *pFVar1;
  __syscall_slong_t _Var2;
  parser<int> pVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  int *piVar7;
  ostream *poVar8;
  char *pcVar9;
  ulong uVar10;
  reference pbVar11;
  raw_ostream *in_R9;
  StringRef Overview;
  char local_b58 [8];
  char buf_final [64];
  char buf_prev [64];
  undefined1 local_ad0 [8];
  timespec final_timestamp;
  timespec now;
  undefined1 local_a90 [8];
  timespec previous_timestamp;
  char *filename;
  string file;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a58;
  iterator __end1;
  iterator __begin1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  double value;
  double adjust_relative_sec;
  timespec time_to_set;
  mode mode;
  NumOccurrencesFlag local_a04;
  StringRef local_a00;
  desc local_9f0;
  FormattingFlags local_9dc;
  undefined1 local_9d8 [8];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  InputFilenames;
  undefined1 local_900 [8];
  alias VerboseA;
  desc local_850;
  undefined1 local_840 [8];
  opt<bool,_false,_llvm::cl::parser<bool>_> Verbose;
  undefined1 local_780 [8];
  alias FilenameA;
  value_desc local_6d0;
  StringRef local_6c0;
  desc local_6b0;
  initializer<char[1]> local_6a0;
  undefined1 local_698 [8];
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Filename;
  desc local_598;
  undefined1 local_588 [8];
  opt<bool,_false,_llvm::cl::parser<bool>_> NowM;
  desc local_4c0;
  undefined1 local_4b0 [8];
  opt<bool,_false,_llvm::cl::parser<bool>_> NowP;
  desc local_3e8;
  undefined1 local_3d8 [8];
  opt<bool,_false,_llvm::cl::parser<bool>_> MTimeM;
  desc local_310;
  undefined1 local_300 [8];
  opt<bool,_false,_llvm::cl::parser<bool>_> MTimeA;
  undefined1 local_240 [8];
  alias AdjustA;
  desc local_190;
  int local_17c;
  initializer<int> local_178;
  undefined1 local_170 [8];
  opt<int,_false,_llvm::cl::parser<int>_> Adjust;
  char **argv_local;
  int argc_local;
  
  local_17c = 0;
  Adjust.Parser.super_basic_parser<int>.super_basic_parser_impl._vptr_basic_parser_impl =
       (basic_parser<int>)(basic_parser<int>)argv;
  local_178 = llvm::cl::init<int>(&local_17c);
  strlen("Move access and modification times");
  llvm::cl::desc::desc(&local_190,stack0xfffffffffffffe60);
  llvm::cl::opt<int,false,llvm::cl::parser<int>>::
  opt<char[7],llvm::cl::initializer<int>,llvm::cl::desc>
            ((opt<int,false,llvm::cl::parser<int>> *)local_170,(char (*) [7])"adjust",&local_178,
             &local_190);
  llvm::cl::aliasopt::aliasopt((aliasopt *)&MTimeA.Parser,(Option *)local_170);
  llvm::cl::alias::alias<char[2],llvm::cl::aliasopt>
            ((alias *)local_240,(char (*) [2])0x22003a,(aliasopt *)&MTimeA.Parser);
  strlen("Move the a/mtime a smallest amount backwards");
  llvm::cl::desc::desc(&local_310,stack0xfffffffffffffce0);
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[14],llvm::cl::desc>
            ((opt<bool,false,llvm::cl::parser<bool>> *)local_300,(char (*) [14])"mtime-add-ulp",
             &local_310);
  strlen("Move the a/mtime a smallest amount Forwards");
  llvm::cl::desc::desc(&local_3e8,stack0xfffffffffffffc08);
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[16],llvm::cl::desc>
            ((opt<bool,false,llvm::cl::parser<bool>> *)local_3d8,(char (*) [16])"mtime-minus-ulp",
             &local_3e8);
  strlen("Set to current time plus epsilon");
  llvm::cl::desc::desc(&local_4c0,stack0xfffffffffffffb30);
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[13],llvm::cl::desc>
            ((opt<bool,false,llvm::cl::parser<bool>> *)local_4b0,(char (*) [13])"now-plus-ulp",
             &local_4c0);
  strlen("Set to current time minus epsilon");
  llvm::cl::desc::desc(&local_598,stack0xfffffffffffffa58);
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[14],llvm::cl::desc>
            ((opt<bool,false,llvm::cl::parser<bool>> *)local_588,(char (*) [14])"now-minus-ulp",
             &local_598);
  local_6a0 = llvm::cl::init<char[1]>((char (*) [1])0x20f811);
  strlen("Set access and modification times from FILE");
  llvm::cl::desc::desc(&local_6b0,local_6c0);
  strlen("file");
  llvm::cl::value_desc::value_desc(&local_6d0,stack0xfffffffffffff920);
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[10],llvm::cl::initializer<char[1]>,llvm::cl::desc,llvm::cl::value_desc>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)local_698,
             (char (*) [10])"from-file",&local_6a0,&local_6b0,&local_6d0);
  llvm::cl::aliasopt::aliasopt((aliasopt *)&Verbose.Parser,(Option *)local_698);
  llvm::cl::alias::alias<char[2],llvm::cl::aliasopt>
            ((alias *)local_780,(char (*) [2])0x211140,(aliasopt *)&Verbose.Parser);
  strlen("Show what is being done");
  llvm::cl::desc::desc(&local_850,stack0xfffffffffffff7a0);
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[8],llvm::cl::desc>
            ((opt<bool,false,llvm::cl::parser<bool>> *)local_840,(char (*) [8])"verbose",&local_850)
  ;
  llvm::cl::aliasopt::aliasopt((aliasopt *)&InputFilenames.Parser,(Option *)local_840);
  llvm::cl::alias::alias<char[2],llvm::cl::aliasopt>
            ((alias *)local_900,(char (*) [2])0x2209d7,(aliasopt *)&InputFilenames.Parser);
  local_9dc = Positional;
  strlen("<Input files>");
  llvm::cl::desc::desc(&local_9f0,local_a00);
  local_a04 = OneOrMore;
  llvm::cl::list<std::__cxx11::string,bool,llvm::cl::parser<std::__cxx11::string>>::
  list<llvm::cl::FormattingFlags,llvm::cl::desc,llvm::cl::NumOccurrencesFlag>
            ((list<std::__cxx11::string,bool,llvm::cl::parser<std::__cxx11::string>> *)local_9d8,
             &local_9dc,&local_9f0,&local_a04);
  pVar3 = Adjust.Parser;
  sVar6 = strlen("Modify timestamps of existing files\n");
  Overview.Length = 0;
  Overview.Data = (char *)sVar6;
  llvm::cl::ParseCommandLineOptions
            ((cl *)(ulong)(uint)argc,
             (int)pVar3.super_basic_parser<int>.super_basic_parser_impl._vptr_basic_parser_impl,
             (char **)"Modify timestamps of existing files\n",Overview,in_R9);
  time_to_set.tv_nsec._4_4_ = 0;
  adjust_relative_sec = 0.0;
  time_to_set.tv_sec = 0x3fffffff;
  value = 0.0;
  bVar4 = llvm::cl::opt_storage::operator_cast_to_bool
                    ((opt_storage *)&MTimeM.super_Option.FullyInitialized);
  if (bVar4) {
    time_to_set.tv_nsec._4_4_ = 3;
  }
  bVar4 = llvm::cl::opt_storage::operator_cast_to_bool
                    ((opt_storage *)&MTimeA.super_Option.FullyInitialized);
  if (bVar4) {
    time_to_set.tv_nsec._4_4_ = 4;
  }
  bVar4 = llvm::cl::opt_storage::operator_cast_to_bool
                    ((opt_storage *)&NowP.super_Option.FullyInitialized);
  if (bVar4) {
    time_to_set.tv_nsec._4_4_ = 6;
  }
  bVar4 = llvm::cl::opt_storage::operator_cast_to_bool
                    ((opt_storage *)&NowM.super_Option.FullyInitialized);
  if (bVar4) {
    time_to_set.tv_nsec._4_4_ = 5;
  }
  iVar5 = llvm::cl::opt_storage::operator_cast_to_int
                    ((opt_storage *)&Adjust.super_Option.FullyInitialized);
  if (iVar5 != 0) {
    iVar5 = llvm::cl::opt_storage::operator_cast_to_int
                      ((opt_storage *)&Adjust.super_Option.FullyInitialized);
    value = (double)iVar5;
    if ((value < -1000000.0) || (1000000.0 < value)) {
      piVar7 = __errno_location();
      *piVar7 = 0x22;
    }
    piVar7 = __errno_location();
    if (*piVar7 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"--adjust ");
      iVar5 = llvm::cl::opt_storage::operator_cast_to_int
                        ((opt_storage *)&Adjust.super_Option.FullyInitialized);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
      poVar8 = std::operator<<(poVar8,": ");
      piVar7 = __errno_location();
      pcVar9 = strerror(*piVar7);
      poVar8 = std::operator<<(poVar8,pcVar9);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      exit(0x41);
    }
    time_to_set.tv_nsec._4_4_ = 2;
  }
  uVar10 = std::__cxx11::string::empty();
  if ((uVar10 & 1) == 0) {
    pcVar9 = (char *)std::__cxx11::string::c_str();
    iVar5 = get_file_mtime(pcVar9,(timespec *)&adjust_relative_sec);
    if (iVar5 == -1) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"--from-file ");
      poVar8 = std::operator<<(poVar8,(string *)&Filename.super_Option.FullyInitialized);
      poVar8 = std::operator<<(poVar8,": ");
      piVar7 = __errno_location();
      pcVar9 = strerror(*piVar7);
      poVar8 = std::operator<<(poVar8,pcVar9);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      exit(0x41);
    }
    time_to_set.tv_nsec._4_4_ = 1;
  }
  bVar4 = llvm::cl::
          list_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
          ::empty((list_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                   *)&InputFilenames.super_Option.FullyInitialized);
  if (!bVar4) {
    __end1 = llvm::cl::
             list_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
             ::begin((list_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                      *)&InputFilenames.super_Option.FullyInitialized);
    local_a58._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         llvm::cl::
         list_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
         ::end((list_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                *)&InputFilenames.super_Option.FullyInitialized);
    do {
      bVar4 = __gnu_cxx::operator!=(&__end1,&local_a58);
      if (!bVar4) {
        llvm::cl::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_9d8);
        llvm::cl::alias::~alias((alias *)local_900);
        llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt
                  ((opt<bool,_false,_llvm::cl::parser<bool>_> *)local_840);
        llvm::cl::alias::~alias((alias *)local_780);
        llvm::cl::
        opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~opt((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_698);
        llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt
                  ((opt<bool,_false,_llvm::cl::parser<bool>_> *)local_588);
        llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt
                  ((opt<bool,_false,_llvm::cl::parser<bool>_> *)local_4b0);
        llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt
                  ((opt<bool,_false,_llvm::cl::parser<bool>_> *)local_3d8);
        llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt
                  ((opt<bool,_false,_llvm::cl::parser<bool>_> *)local_300);
        llvm::cl::alias::~alias((alias *)local_240);
        llvm::cl::opt<int,_false,_llvm::cl::parser<int>_>::~opt
                  ((opt<int,_false,_llvm::cl::parser<int>_> *)local_170);
        return 0;
      }
      pbVar11 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
      std::__cxx11::string::string((string *)&filename,(string *)pbVar11);
      previous_timestamp.tv_nsec = std::__cxx11::string::c_str();
      local_a90 = (undefined1  [8])0x0;
      previous_timestamp.tv_sec = 0x3ffffffe;
      bVar4 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage *)&Verbose.super_Option.FullyInitialized);
      if ((bVar4) &&
         (iVar5 = get_file_mtime((char *)previous_timestamp.tv_nsec,(timespec *)local_a90),
         _Var2 = previous_timestamp.tv_nsec, pFVar1 = _stderr, iVar5 == -1)) {
        piVar7 = __errno_location();
        pcVar9 = strerror(*piVar7);
        fprintf(pFVar1,"%s: %s\n",_Var2,pcVar9);
        exit(0x42);
      }
      switch(time_to_set.tv_nsec._4_4_) {
      case 0:
      case 1:
        time_to_set_00.tv_nsec = time_to_set.tv_sec;
        time_to_set_00.tv_sec = (__time_t)adjust_relative_sec;
        iVar5 = file_time_set_fixed((char *)previous_timestamp.tv_nsec,time_to_set_00);
        _Var2 = previous_timestamp.tv_nsec;
        pFVar1 = _stderr;
        if (iVar5 == -1) {
          piVar7 = __errno_location();
          pcVar9 = strerror(*piVar7);
          fprintf(pFVar1,"%s: %s\n",_Var2,pcVar9);
          exit(0x42);
        }
        break;
      case 2:
        iVar5 = file_time_adjust_relative((char *)previous_timestamp.tv_nsec,value);
        _Var2 = previous_timestamp.tv_nsec;
        pFVar1 = _stderr;
        if (iVar5 == -1) {
          piVar7 = __errno_location();
          pcVar9 = strerror(*piVar7);
          fprintf(pFVar1,"%s: %s\n",_Var2,pcVar9);
          exit(0x42);
        }
        break;
      case 3:
      case 4:
        iVar5 = 1;
        if (time_to_set.tv_nsec._4_4_ == 3) {
          iVar5 = -1;
        }
        iVar5 = file_time_adjust_epsilon((char *)previous_timestamp.tv_nsec,iVar5);
        _Var2 = previous_timestamp.tv_nsec;
        pFVar1 = _stderr;
        if (iVar5 == -1) {
          piVar7 = __errno_location();
          pcVar9 = strerror(*piVar7);
          fprintf(pFVar1,"%s: %s\n",_Var2,pcVar9);
          exit(0x42);
        }
        break;
      case 5:
      case 6:
        final_timestamp.tv_nsec = 0;
        iVar5 = file_time_set_fixed((char *)previous_timestamp.tv_nsec,
                                    (timespec)(ZEXT816(0x3fffffff) << 0x40));
        _Var2 = previous_timestamp.tv_nsec;
        pFVar1 = _stderr;
        if (iVar5 == -1) {
          piVar7 = __errno_location();
          pcVar9 = strerror(*piVar7);
          fprintf(pFVar1,"%s: %s\n",_Var2,pcVar9);
          exit(0x42);
        }
        iVar5 = 1;
        if (time_to_set.tv_nsec._4_4_ == 5) {
          iVar5 = -1;
        }
        iVar5 = file_time_adjust_epsilon((char *)previous_timestamp.tv_nsec,iVar5);
        _Var2 = previous_timestamp.tv_nsec;
        pFVar1 = _stderr;
        if (iVar5 == -1) {
          piVar7 = __errno_location();
          pcVar9 = strerror(*piVar7);
          fprintf(pFVar1,"%s: %s\n",_Var2,pcVar9);
          exit(0x42);
        }
      }
      bVar4 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage *)&Verbose.super_Option.FullyInitialized);
      if (bVar4) {
        iVar5 = get_file_mtime((char *)previous_timestamp.tv_nsec,(timespec *)local_ad0);
        _Var2 = previous_timestamp.tv_nsec;
        pFVar1 = _stderr;
        if (iVar5 == -1) {
          piVar7 = __errno_location();
          pcVar9 = strerror(*piVar7);
          fprintf(pFVar1,"%s: %s\n",_Var2,pcVar9);
          exit(0x42);
        }
        fprintf(_stderr,"%s: ",previous_timestamp.tv_nsec);
        switch(time_to_set.tv_nsec._4_4_) {
        case 0:
        case 1:
          fprintf(_stderr,"reset");
          break;
        case 2:
          fprintf(_stderr,"adjusted %+.9gs",value);
          break;
        case 3:
          fprintf(_stderr,"adjusted backward");
          break;
        case 4:
          fprintf(_stderr,"adjusted forward");
          break;
        case 5:
          fprintf(_stderr,"set to now - epsilon");
          break;
        case 6:
          fprintf(_stderr,"set to now + epsilon");
        }
        ts_00.tv_nsec = previous_timestamp.tv_sec;
        ts_00.tv_sec = (__time_t)local_a90;
        time_format(buf_final + 0x38,0x40,ts_00);
        ts.tv_nsec = final_timestamp.tv_sec;
        ts.tv_sec = (__time_t)local_ad0;
        time_format(local_b58,0x40,ts);
        fprintf(_stderr,"\n  from %s\n  to   %s\n",buf_final + 0x38,local_b58);
      }
      std::__cxx11::string::~string((string *)&filename);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    } while( true );
  }
  llvm::cl::PrintHelpMessage(false,false);
  exit(0x40);
}

Assistant:

int main(int argc, char **argv) {
  using namespace llvm;

  cl::opt<int>         Adjust   ("adjust", cl::init(0), cl::desc("Move access and modification times"));
  cl::alias            AdjustA  ("a", cl::aliasopt(Adjust));
  cl::opt<bool>        MTimeA   ("mtime-add-ulp", cl::desc("Move the a/mtime a smallest amount backwards"));
  cl::opt<bool>        MTimeM   ("mtime-minus-ulp", cl::desc("Move the a/mtime a smallest amount Forwards"));
  cl::opt<bool>        NowP     ("now-plus-ulp", cl::desc("Set to current time plus epsilon"));
  cl::opt<bool>        NowM     ("now-minus-ulp", cl::desc("Set to current time minus epsilon"));
  cl::opt<std::string> Filename ("from-file", cl::init(""), cl::desc("Set access and modification times from FILE"), cl::value_desc("file"));
  cl::alias            FilenameA("f", cl::aliasopt(Filename));
  cl::opt<bool>        Verbose  ("verbose", cl::desc("Show what is being done"));
  cl::alias            VerboseA ("v", cl::aliasopt(Verbose));
  cl::list<std::string> InputFilenames(cl::Positional, cl::desc("<Input files>"), cl::OneOrMore);

  cl::ParseCommandLineOptions(argc, argv, "Modify timestamps of existing files\n");

  enum mode {
    ModeSetToNow,
    ModeSetToFile,      // -f, --from-file
    ModeAdjustMtime,    // -a, --adjust
    ModeMtimeMinusULP,  // --mtime-minus-ulp
    ModeMtimePlusULP,   // --mtime-plus-ulp
    ModeNowMinusULP,    // --now-minus-ulp
    ModeNowPlusULP,     // --now-plus-ulp
  } mode = ModeSetToNow;

  struct timespec time_to_set = { 0, UTIME_NOW };
  double adjust_relative_sec = 0;

  if (MTimeM) {
    mode = ModeMtimeMinusULP;
  }
  if (MTimeA) {
    mode = ModeMtimePlusULP;
  }
  if (NowP) {
    mode = ModeNowPlusULP;
  }
  if (NowM) {
    mode = ModeNowMinusULP;
  }
  if (Adjust) {
    double value = Adjust;
    if (value < -1000000 || value > 1000000) {
      errno = ERANGE;
    }
    if (errno != 0) {
      std::cerr << "--adjust " << Adjust << ": " << strerror(errno) << std::endl;
      exit(EX_DATAERR);
    }
    adjust_relative_sec = value;
    mode = ModeAdjustMtime;
  }
  if (!Filename.empty()) {
    if (get_file_mtime(Filename.c_str(), &time_to_set) == -1) {
      std::cerr << "--from-file " << Filename << ": " << strerror(errno) << std::endl;
      exit(EX_DATAERR);
    }
    mode = ModeSetToFile;
  }

  // A list of filenames is required.
  if (InputFilenames.empty()) {
    cl::PrintHelpMessage();
    exit(EX_USAGE);
  }

  // Modify all files' access and modification times.
  for (std::string file : InputFilenames) {
    const char* filename = file.c_str();

    struct timespec previous_timestamp = { 0, UTIME_OMIT };
    if (Verbose) {
      if (get_file_mtime(filename, &previous_timestamp) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
    }

    switch (mode) {
    case ModeSetToNow:
    case ModeSetToFile:   // -f, --from
      if (file_time_set_fixed(filename, time_to_set) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
      break;
    case ModeAdjustMtime:  // -a, --adjust
      if (file_time_adjust_relative(filename, adjust_relative_sec) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
      break;
    case ModeMtimePlusULP:
    case ModeMtimeMinusULP:
      if (file_time_adjust_epsilon(filename, mode == ModeMtimeMinusULP ? -1 : 1) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
      break;
    case ModeNowPlusULP:
    case ModeNowMinusULP:
      struct timespec now = { 0, UTIME_NOW };
      if (file_time_set_fixed(filename, now) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
      if (file_time_adjust_epsilon(filename, mode == ModeNowMinusULP ? -1 : 1) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
      break;
    }

    if (Verbose) {
      struct timespec final_timestamp;
      if (get_file_mtime(filename, &final_timestamp) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }

      fprintf(stderr, "%s: ", filename);
      switch (mode) {
      case ModeSetToNow:
      case ModeSetToFile:
        fprintf(stderr, "reset");
        break;
      case ModeAdjustMtime:
        fprintf(stderr, "adjusted %+.9gs", adjust_relative_sec);
        break;
      case ModeMtimeMinusULP:
        fprintf(stderr, "adjusted backward");
        break;
      case ModeMtimePlusULP:
        fprintf(stderr, "adjusted forward");
        break;
      case ModeNowMinusULP:
        fprintf(stderr, "set to now - epsilon");
        break;
      case ModeNowPlusULP:
        fprintf(stderr, "set to now + epsilon");
        break;
      }

      char buf_prev[64];
      char buf_final[64];
      time_format(buf_prev, sizeof(buf_prev), previous_timestamp);
      time_format(buf_final, sizeof(buf_final), final_timestamp);

      fprintf(stderr, "\n  from %s\n  to   %s\n", buf_prev, buf_final);
    }
  }

  return 0;
}